

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_primitive.cc
# Opt level: O0

string * __thiscall PPConstDef::ToCode_abi_cxx11_(PPConstDef *this,Env *env)

{
  undefined8 uVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 in_RDX;
  Env *in_RSI;
  Env *in_RDI;
  string type_str;
  Type *type;
  Env *in_stack_00000100;
  Expr *in_stack_00000108;
  ID *in_stack_ffffffffffffff78;
  Env *out_cc;
  Expr *this_00;
  Type *in_stack_ffffffffffffffb8;
  IDType in_stack_ffffffffffffffc4;
  ID *in_stack_ffffffffffffffc8;
  Env *in_stack_ffffffffffffffd0;
  
  out_cc = in_RDI;
  uVar1 = Expr::DataType(in_stack_00000108,in_stack_00000100);
  Env::AddID(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
             in_stack_ffffffffffffffb8);
  Env::SetEvaluated(in_RSI,(ID *)in_RDX,(bool)(char)((ulong)uVar1 >> 0x38));
  this_00 = (Expr *)&stack0xffffffffffffffc0;
  (**(code **)(*(long *)uVar1 + 0x58))();
  uVar1 = std::__cxx11::string::c_str();
  pcVar2 = Env::LValue(in_RDI,in_stack_ffffffffffffff78);
  pcVar3 = Expr::EvalExpr(this_00,(Output *)out_cc,in_RDI);
  strfmt_abi_cxx11_((char *)in_RDI,"%s %s = %s",uVar1,pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return (string *)out_cc;
}

Assistant:

string PPConstDef::ToCode(Env* env)
	{
	Type* type = expr_->DataType(env);
	env->AddID(id_, TEMP_VAR, type);
	env->SetEvaluated(id_);

	string type_str = type->DataTypeStr();
	return strfmt("%s %s = %s", type_str.c_str(), env->LValue(id_), expr_->EvalExpr(nullptr, env));
	}